

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O0

void __thiscall libtorrent::aux::part_file::~part_file(part_file *this)

{
  undefined1 local_20 [8];
  error_code ec;
  part_file *this_local;
  
  ec.cat_ = (error_category *)this;
  boost::system::error_code::error_code((error_code *)local_20);
  flush_metadata_impl(this,(error_code *)local_20);
  ::std::
  unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
  ::~unordered_map(&this->m_piece_map);
  ::std::
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
  ::~vector(&this->m_free_slots);
  ::std::__cxx11::string::~string((string *)&this->m_name);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

part_file::~part_file()
	{
		error_code ec;
		flush_metadata_impl(ec);
	}